

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::MultiTransformNode::MultiTransformNode
          (MultiTransformNode *this,avector<avector<AffineSpace3ff>_> *spaces_in,
          Ref<embree::SceneGraph::Node> *child)

{
  ulong uVar1;
  Vector *pVVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Node *pNVar5;
  ulong uVar6;
  size_t sVar7;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar8;
  undefined8 uVar9;
  void *pvVar10;
  size_t i;
  ulong uVar11;
  void *ptr;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  Transformations local_a8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  Node::Node(&this->super_Node,false);
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__MultiTransformNode_002a75e0
  ;
  (this->spaces).
  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->spaces).
  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->spaces).
  super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar5 = child->ptr;
  (this->child).ptr = pNVar5;
  if (pNVar5 != (Node *)0x0) {
    (*(pNVar5->super_RefCount)._vptr_RefCount[2])();
  }
  uVar6 = spaces_in->size_active;
  sVar7 = spaces_in->items->size_active;
  for (sVar12 = 0; sVar12 != sVar7; sVar12 = sVar12 + 1) {
    uVar11 = 0;
    ptr = (void *)0x0;
    uVar15 = 0;
    while (uVar15 != uVar6) {
      uVar1 = uVar15 + 1;
      uVar14 = uVar11;
      if ((uVar11 < uVar1) && (uVar13 = uVar11, uVar14 = uVar1, uVar11 != 0)) {
        for (; uVar14 = uVar13, uVar13 < uVar1; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
        }
      }
      pAVar8 = spaces_in->items[uVar15].items;
      local_48 = *(undefined8 *)&pAVar8[sVar12].l.vx.field_0;
      uStack_40 = *(undefined8 *)((long)&pAVar8[sVar12].l.vx.field_0 + 8);
      pVVar2 = &pAVar8[sVar12].l.vy;
      local_58 = *(undefined8 *)&pVVar2->field_0;
      uStack_50 = *(undefined8 *)((long)&pVVar2->field_0 + 8);
      pVVar2 = &pAVar8[sVar12].l.vz;
      local_68 = *(undefined8 *)&pVVar2->field_0;
      uStack_60 = *(undefined8 *)((long)&pVVar2->field_0 + 8);
      local_78 = *(undefined8 *)&pAVar8[sVar12].p.field_0;
      uStack_70 = *(undefined8 *)((long)&pAVar8[sVar12].p.field_0 + 8);
      if (uVar11 != uVar14) {
        pvVar10 = alignedMalloc(uVar14 << 6,0x10);
        lVar16 = 0x30;
        uVar11 = uVar15;
        while (bVar17 = uVar11 != 0, uVar11 = uVar11 - 1, bVar17) {
          puVar4 = (undefined8 *)((long)ptr + lVar16 + -0x30);
          uVar9 = puVar4[1];
          puVar3 = (undefined8 *)((long)pvVar10 + lVar16 + -0x30);
          *puVar3 = *puVar4;
          puVar3[1] = uVar9;
          puVar4 = (undefined8 *)((long)ptr + lVar16 + -0x20);
          uVar9 = puVar4[1];
          puVar3 = (undefined8 *)((long)pvVar10 + lVar16 + -0x20);
          *puVar3 = *puVar4;
          puVar3[1] = uVar9;
          puVar4 = (undefined8 *)((long)ptr + lVar16 + -0x10);
          uVar9 = puVar4[1];
          puVar3 = (undefined8 *)((long)pvVar10 + lVar16 + -0x10);
          *puVar3 = *puVar4;
          puVar3[1] = uVar9;
          uVar9 = ((undefined8 *)((long)ptr + lVar16))[1];
          *(undefined8 *)((long)pvVar10 + lVar16) = *(undefined8 *)((long)ptr + lVar16);
          ((undefined8 *)((long)pvVar10 + lVar16))[1] = uVar9;
          lVar16 = lVar16 + 0x40;
        }
        alignedFree(ptr);
        ptr = pvVar10;
        uVar11 = uVar14;
      }
      lVar16 = uVar15 * 0x40;
      *(undefined8 *)((long)ptr + lVar16) = local_48;
      ((undefined8 *)((long)ptr + lVar16))[1] = uStack_40;
      puVar4 = (undefined8 *)((long)ptr + lVar16 + 0x10);
      *puVar4 = local_58;
      puVar4[1] = uStack_50;
      puVar4 = (undefined8 *)((long)ptr + lVar16 + 0x20);
      *puVar4 = local_68;
      puVar4[1] = uStack_60;
      puVar4 = (undefined8 *)((long)ptr + lVar16 + 0x30);
      *puVar4 = local_78;
      puVar4[1] = uStack_70;
      uVar15 = uVar1;
    }
    local_a8.time_range.lower = 0.0;
    local_a8.time_range.upper = 1.0;
    local_a8.spaces.size_active = uVar6;
    local_a8.spaces.size_alloced = uVar11;
    local_a8.spaces.items =
         (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(uVar11 << 6,0x10);
    lVar16 = 0x30;
    for (uVar11 = 0; uVar11 < local_a8.spaces.size_active; uVar11 = uVar11 + 1) {
      puVar4 = (undefined8 *)((long)ptr + lVar16 + -0x30);
      uVar9 = puVar4[1];
      puVar3 = (undefined8 *)((long)local_a8.spaces.items + lVar16 + -0x30);
      *puVar3 = *puVar4;
      puVar3[1] = uVar9;
      puVar4 = (undefined8 *)((long)ptr + lVar16 + -0x20);
      uVar9 = puVar4[1];
      puVar3 = (undefined8 *)((long)local_a8.spaces.items + lVar16 + -0x20);
      *puVar3 = *puVar4;
      puVar3[1] = uVar9;
      puVar4 = (undefined8 *)((long)ptr + lVar16 + -0x10);
      uVar9 = puVar4[1];
      puVar3 = (undefined8 *)((long)local_a8.spaces.items + lVar16 + -0x10);
      *puVar3 = *puVar4;
      puVar3[1] = uVar9;
      uVar9 = ((undefined8 *)((long)ptr + lVar16))[1];
      puVar4 = (undefined8 *)((long)&((local_a8.spaces.items)->l).vx.field_0 + lVar16);
      *puVar4 = *(undefined8 *)((long)ptr + lVar16);
      puVar4[1] = uVar9;
      lVar16 = lVar16 + 0x40;
    }
    local_a8.quaternion = false;
    std::
    vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ::emplace_back<embree::SceneGraph::Transformations>(&this->spaces,&local_a8);
    Transformations::~Transformations(&local_a8);
    alignedFree(ptr);
  }
  return;
}

Assistant:

MultiTransformNode (const avector<avector<AffineSpace3ff>>& spaces_in, const Ref<Node>& child)
        : child(child)
      {
        assert(spaces_in.size() > 0);
        const size_t time_steps = spaces_in.size();
        const size_t array_size = spaces_in[0].size();
        for (size_t i = 0; i < array_size; ++i) {
          avector<AffineSpace3ff> s;
          for (size_t j = 0; j < time_steps; ++j) {
            s.push_back(spaces_in[j][i]);
          }
          spaces.push_back(Transformations(s));
        }
      }